

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteReturning(sqlite3 *db,void *pArg)

{
  sqlite3 *db_00;
  long in_RDI;
  Hash *pHash;
  Returning *pRet;
  ExprList *in_stack_ffffffffffffffd8;
  
  db_00 = (sqlite3 *)(*(long *)(*(long *)(in_RDI + 0x20) + 0x38) + 0x38);
  sqlite3HashInsert((Hash *)pArg,(char *)pRet,pHash);
  sqlite3ExprListDelete(db_00,in_stack_ffffffffffffffd8);
  sqlite3DbFree(db_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void sqlite3DeleteReturning(sqlite3 *db, void *pArg){
  Returning *pRet = (Returning*)pArg;
  Hash *pHash;
  pHash = &(db->aDb[1].pSchema->trigHash);
  sqlite3HashInsert(pHash, pRet->zName, 0);
  sqlite3ExprListDelete(db, pRet->pReturnEL);
  sqlite3DbFree(db, pRet);
}